

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

uchar ** tinyexr::AllocateImage
                   (int num_channels,EXRChannelInfo *channels,int *requested_pixel_types,
                   int data_width,int data_height)

{
  uchar **ppuVar1;
  long lVar2;
  uchar *puVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int in_R8D;
  size_t data_len;
  size_t c;
  uchar **images;
  ulong local_30;
  
  ppuVar1 = (uchar **)malloc((long)in_EDI << 3);
  for (local_30 = 0; local_30 < (ulong)(long)in_EDI; local_30 = local_30 + 1) {
    lVar2 = (long)in_ECX * (long)in_R8D;
    if (*(int *)(in_RSI + local_30 * 0x110 + 0x100) == 1) {
      if (*(int *)(in_RDX + local_30 * 4) == 1) {
        puVar3 = (uchar *)malloc(lVar2 * 2);
        ppuVar1[local_30] = puVar3;
      }
      else if (*(int *)(in_RDX + local_30 * 4) == 2) {
        puVar3 = (uchar *)malloc(lVar2 * 4);
        ppuVar1[local_30] = puVar3;
      }
    }
    else if (*(int *)(in_RSI + local_30 * 0x110 + 0x100) == 2) {
      puVar3 = (uchar *)malloc(lVar2 * 4);
      ppuVar1[local_30] = puVar3;
    }
    else if (*(int *)(in_RSI + local_30 * 0x110 + 0x100) == 0) {
      puVar3 = (uchar *)malloc(lVar2 * 4);
      ppuVar1[local_30] = puVar3;
    }
  }
  return ppuVar1;
}

Assistant:

static unsigned char **AllocateImage(int num_channels,
                                     const EXRChannelInfo *channels,
                                     const int *requested_pixel_types,
                                     int data_width, int data_height) {
  unsigned char **images =
      reinterpret_cast<unsigned char **>(static_cast<float **>(
          malloc(sizeof(float *) * static_cast<size_t>(num_channels))));

  for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
    size_t data_len =
        static_cast<size_t>(data_width) * static_cast<size_t>(data_height);
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      // pixel_data_size += sizeof(unsigned short);
      // channel_offset += sizeof(unsigned short);
      // Alloc internal image for half type.
      if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
        images[c] =
            reinterpret_cast<unsigned char *>(static_cast<unsigned short *>(
                malloc(sizeof(unsigned short) * data_len)));
      } else if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
        images[c] = reinterpret_cast<unsigned char *>(
            static_cast<float *>(malloc(sizeof(float) * data_len)));
      } else {
        assert(0);
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      // pixel_data_size += sizeof(float);
      // channel_offset += sizeof(float);
      images[c] = reinterpret_cast<unsigned char *>(
          static_cast<float *>(malloc(sizeof(float) * data_len)));
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      // pixel_data_size += sizeof(unsigned int);
      // channel_offset += sizeof(unsigned int);
      images[c] = reinterpret_cast<unsigned char *>(
          static_cast<unsigned int *>(malloc(sizeof(unsigned int) * data_len)));
    } else {
      assert(0);
    }
  }

  return images;
}